

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_indexed_child_t art_node_child_at(art_node_t *node,int index)

{
  undefined1 auVar1 [16];
  art_node_t *paVar2;
  _Bool _Var3;
  uint8_t uVar4;
  int in_ESI;
  art_node256_t *in_RDI;
  art_indexed_child_t indexed_child;
  art_indexed_child_t local_10;
  
  paVar2 = local_10.child;
  _Var3 = art_is_leaf((art_node_t *)in_RDI);
  if (_Var3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_10.child;
    local_10 = (art_indexed_child_t)(auVar1 << 0x40);
  }
  else {
    uVar4 = art_get_type(&in_RDI->base);
    switch(uVar4) {
    case '\0':
      local_10 = art_node4_child_at((art_node4_t *)in_RDI,in_ESI);
      break;
    case '\x01':
      local_10 = art_node16_child_at((art_node16_t *)in_RDI,in_ESI);
      break;
    case '\x02':
      local_10 = art_node48_child_at((art_node48_t *)in_RDI,in_ESI);
      break;
    case '\x03':
      local_10 = art_node256_child_at(in_RDI,in_ESI);
      break;
    default:
      local_10._0_9_ = ZEXT89(0);
      local_10._10_6_ = SUB86((ulong)paVar2 >> 0x10,0);
      local_10.key_chunk = '\0';
    }
  }
  return local_10;
}

Assistant:

static art_indexed_child_t art_node_child_at(const art_node_t *node,
                                             int index) {
    if (art_is_leaf(node)) {
        art_indexed_child_t indexed_child;
        indexed_child.child = NULL;
        return indexed_child;
    }
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE:
            return art_node4_child_at((art_node4_t *)node, index);
        case ART_NODE16_TYPE:
            return art_node16_child_at((art_node16_t *)node, index);
        case ART_NODE48_TYPE:
            return art_node48_child_at((art_node48_t *)node, index);
        case ART_NODE256_TYPE:
            return art_node256_child_at((art_node256_t *)node, index);
        default:
            assert(false);
            return (art_indexed_child_t){0};
    }
}